

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O1

JL_STATUS ParseString(char *String,size_t StringLength,_Bool IsBareWord,_Bool AllowNewLines,
                     size_t *pAmountProcessed,char **pProcessedString)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  size_t i;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  undefined7 in_register_00000011;
  char *pcVar11;
  long lVar12;
  size_t *psVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  uint32_t number;
  uint32_t lowSurrogate;
  uint local_6c;
  size_t *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  size_t local_48;
  ulong local_40;
  char **local_38;
  
  if ((int)CONCAT71(in_register_00000011,IsBareWord) == 0) {
    JVar5 = JL_STATUS_INVALID_DATA;
    if (1 < StringLength) {
      lVar12 = 0;
      pcVar6 = (char *)0x1;
      do {
        pcVar11 = pcVar6;
        cVar2 = String[(long)pcVar11];
        if (cVar2 == '\\') {
          pcVar14 = pcVar11 + 1;
          lVar15 = lVar12 + 1;
          if (((AllowNewLines) && (String[(long)pcVar14] == '\r')) &&
             ((String + 2)[(long)pcVar11] == '\n')) {
            lVar15 = lVar12 + 2;
            pcVar14 = pcVar11 + 2;
          }
        }
        else {
          if (cVar2 == (char)((*String == '\'') * '\x05' + '\"')) {
            JVar5 = JL_STATUS_SUCCESS;
            break;
          }
          lVar15 = lVar12;
          pcVar14 = pcVar11;
          if (cVar2 < ' ') {
            *pAmountProcessed = (size_t)pcVar11;
            break;
          }
        }
        lVar12 = lVar15 + 1;
        pcVar6 = pcVar14 + 1;
      } while (pcVar14 + 1 < StringLength);
      goto LAB_0011c0d6;
    }
  }
  else if (StringLength != 0) {
    JVar5 = JL_STATUS_INVALID_DATA;
    lVar12 = 0;
    pcVar6 = (char *)0x0;
    do {
      pcVar11 = pcVar6;
      bVar1 = String[(long)pcVar11];
      pcVar14 = pcVar11;
      if ((bVar1 == 0x24) || (bVar1 == 0x5f)) {
LAB_0011c039:
        JVar4 = JL_STATUS_SUCCESS;
      }
      else if (bVar1 == 0x5c) {
        lVar12 = lVar12 + 1;
        pcVar14 = pcVar11 + 1;
        JVar4 = JVar5;
      }
      else {
        if ((byte)(bVar1 - 0x30) < 10) goto LAB_0011c039;
        JVar4 = JL_STATUS_SUCCESS;
        if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) break;
      }
      JVar5 = JVar4;
      lVar12 = lVar12 + 1;
      pcVar6 = pcVar14 + 1;
    } while (pcVar14 + 1 < StringLength);
    goto LAB_0011c0d6;
  }
  JVar5 = JL_STATUS_INVALID_DATA;
  pcVar11 = (char *)0x0;
  lVar12 = 0;
LAB_0011c0d6:
  if (JVar5 == JL_STATUS_SUCCESS) {
    local_68 = pAmountProcessed;
    pcVar6 = (char *)WjTestLib_Calloc(lVar12 + 1,1);
    if (pcVar6 == (char *)0x0) {
      JVar5 = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      pcVar14 = (char *)(ulong)!IsBareWord;
      JVar5 = JL_STATUS_SUCCESS;
      psVar13 = local_68;
      local_38 = pProcessedString;
      if (pcVar14 < pcVar11) {
        JVar5 = JL_STATUS_SUCCESS;
        lVar15 = 0;
        pcVar16 = pcVar14;
        do {
          if (String[(long)pcVar16] == '\\') {
            bVar1 = (String + 1)[(long)pcVar16];
            if (bVar1 < 0x62) {
              if (bVar1 < 0x2f) {
                if (bVar1 == 0x22) {
                  pcVar6[lVar15] = '\"';
                }
                else {
                  if (bVar1 != 0x27) goto switchD_0011c190_caseD_6f;
                  pcVar6[lVar15] = '\'';
                }
              }
              else if (bVar1 == 0x2f) {
                pcVar6[lVar15] = '/';
              }
              else {
                if (bVar1 != 0x5c) goto switchD_0011c190_caseD_6f;
                pcVar6[lVar15] = '\\';
              }
              goto LAB_0011c416;
            }
            switch(bVar1) {
            case 0x6e:
              pcVar6[lVar15] = '\n';
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_0011c190_caseD_6f:
              if ((!AllowNewLines) || ((bVar1 != 0xd && (bVar1 != 10)))) {
                *psVar13 = (size_t)pcVar16;
                JVar5 = JL_STATUS_INVALID_DATA;
                bVar3 = true;
                goto LAB_0011c41e;
              }
              if ((String + 2)[(long)pcVar16] == '\n' && bVar1 == 0xd) {
                pcVar16 = pcVar16 + 1;
              }
              goto LAB_0011c419;
            case 0x72:
              pcVar6[lVar15] = '\r';
              break;
            case 0x74:
              pcVar6[lVar15] = '\t';
              break;
            case 0x75:
              uVar7 = ~(ulong)pcVar16 + lVar12;
              if (uVar7 < 4) {
                JVar5 = JL_STATUS_INVALID_DATA;
                pcVar9 = (char *)0x0;
              }
              else {
                local_58 = String + (long)pcVar16;
                lVar8 = 0;
                do {
                  bVar1 = (local_58 + 2)[lVar8];
                  if (9 < (byte)(bVar1 - 0x30)) {
                    JVar5 = JL_STATUS_INVALID_DATA;
                    bVar3 = false;
                    uVar10 = bVar1 - 0x41;
                    if ((0x25 < uVar10) || ((0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
                    goto LAB_0011c280;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                JVar5 = JL_STATUS_SUCCESS;
                bVar3 = true;
LAB_0011c280:
                local_40 = uVar7;
                if (bVar3) {
                  local_6c = 0;
                  local_60 = pcVar14;
                  local_50 = pcVar6;
                  __isoc99_sscanf(local_58 + 2,"%4x",&local_6c);
                  uVar7 = (ulong)local_6c;
                  JVar5 = JL_STATUS_INVALID_DATA;
                  if ((local_6c & 0xfffffc00) == 0xdc00) {
LAB_0011c467:
                    JVar5 = JL_STATUS_INVALID_DATA;
                    pcVar9 = (char *)0x0;
                  }
                  else if ((local_6c & 0xfffffc00) == 0xd800) {
                    if (((local_40 < 10) || (local_40 = uVar7, local_58[6] != '\\')) ||
                       (local_58[7] != 'u')) {
                      pcVar9 = (char *)0x0;
                    }
                    else {
                      local_58 = local_58 + 8;
                      lVar8 = 0;
                      do {
                        if (9 < (byte)(local_58[lVar8] - 0x30U)) {
                          JVar5 = JL_STATUS_INVALID_DATA;
                          bVar3 = false;
                          uVar10 = (byte)local_58[lVar8] - 0x41;
                          if ((0x25 < uVar10) ||
                             ((0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
                          goto LAB_0011c377;
                        }
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 4);
                      JVar5 = JL_STATUS_SUCCESS;
                      bVar3 = true;
LAB_0011c377:
                      if (bVar3) {
                        local_48 = local_48 & 0xffffffff00000000;
                        __isoc99_sscanf(local_58,"%4x",&local_48);
                        JVar5 = JL_STATUS_INVALID_DATA;
                        if ((uint)local_48 < 0xdc00) goto LAB_0011c467;
                        pcVar9 = (char *)0x0;
                        if (local_6c < 0xe000) {
                          local_6c = ((uint)local_48 & 0x3ff) + ((uint)local_40 & 0x3ff) * 0x400 +
                                     0x10000;
                          JVar5 = JL_STATUS_SUCCESS;
                          pcVar9 = (char *)0xa;
                        }
                      }
                      else {
                        pcVar9 = (char *)0x0;
                      }
                    }
                  }
                  else {
                    JVar5 = JL_STATUS_SUCCESS;
                    pcVar9 = (char *)0x4;
                  }
                  psVar13 = local_68;
                  pcVar6 = local_50;
                  pcVar14 = local_60;
                  if (JVar5 == JL_STATUS_SUCCESS) {
                    local_48 = 0;
                    local_58 = pcVar9;
                    JVar5 = JlUnicodeValueToUtf8(local_6c,local_50 + lVar15,&local_48);
                    uVar7 = 0;
                    if (JVar5 == JL_STATUS_SUCCESS) {
                      uVar7 = local_48;
                    }
                    lVar15 = lVar15 + uVar7;
                    pcVar9 = local_58;
                    psVar13 = local_68;
                    pcVar6 = local_50;
                    pcVar14 = local_60;
                  }
                }
                else {
                  pcVar9 = (char *)0x0;
                  psVar13 = local_68;
                }
              }
              if (JVar5 == JL_STATUS_SUCCESS) {
                pcVar16 = pcVar16 + (long)pcVar9;
                goto LAB_0011c419;
              }
              *psVar13 = (size_t)pcVar16;
              bVar3 = true;
              goto LAB_0011c41e;
            default:
              if (bVar1 == 0x62) {
                pcVar6[lVar15] = '\b';
              }
              else {
                if (bVar1 != 0x66) goto switchD_0011c190_caseD_6f;
                pcVar6[lVar15] = '\f';
              }
            }
LAB_0011c416:
            lVar15 = lVar15 + 1;
LAB_0011c419:
            pcVar16 = pcVar16 + 1;
            bVar3 = false;
LAB_0011c41e:
            bVar3 = !bVar3;
          }
          else {
            pcVar6[lVar15] = String[(long)pcVar16];
            lVar15 = lVar15 + 1;
            bVar3 = true;
          }
        } while ((bVar3) && (pcVar16 = pcVar16 + 1, pcVar16 < pcVar11));
      }
      if (JVar5 == JL_STATUS_SUCCESS) {
        *local_38 = pcVar6;
        *psVar13 = (size_t)(pcVar11 + (long)pcVar14);
        JVar5 = JL_STATUS_SUCCESS;
      }
      else {
        WjTestLib_Free(pcVar6);
      }
    }
  }
  return JVar5;
}

Assistant:

static
JL_STATUS
    ParseString
    (
        char const*         String,
        size_t              StringLength,
        bool                IsBareWord,
        bool                AllowNewLines,
        size_t*             pAmountProcessed,
        char**              pProcessedString
    )
{
    JL_STATUS jlStatus;
    size_t strLength = 0;
    size_t strEndPos = 0;
    char* processedString = NULL;
    bool singleQuoted = '\'' == String[0] ? true : false;

    // Find end of string
    jlStatus = JL_STATUS_INVALID_DATA;
    if( IsBareWord )
    {
        // Find length of bareword. Simply scan through until we find a non valid bareword char
        for( size_t i=0; i<StringLength; i++ )
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
            }
            else if ( '_' == String[i] || '$' == String[i]
                      || ( String[i] >= 'a' && String[i] <= 'z' )
                      || ( String[i] >= 'A' && String[i] <= 'Z' )
                      || ( String[i] >= '0' && String[i] <= '9' ) )
            {
                jlStatus = JL_STATUS_SUCCESS;   // At least one character
            }
            else
            {
                // End of bareword
                break;
            }
            strLength += 1;
        }
    }
    else
    {
        // Quoted string. Find the length
        for( size_t i=1; i<StringLength; i++ )      // Start at 1 to skip the first double quote
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
                if( AllowNewLines )
                {
                    // Check if we are escaping a crlf sequence
                    if( '\r' == String[i] && '\n' == String[i+1] )
                    {
                        i += 1;
                        strLength += 1;
                    }
                }
            }
            else if(    ( !singleQuoted && '\"' == String[i] )
                     || (  singleQuoted && '\'' == String[i] ) )
            {
                jlStatus = JL_STATUS_SUCCESS;
                break;
            }
            else if( String[i] < 32 )
            {
                // Control chars not allowed.
                jlStatus = JL_STATUS_INVALID_DATA;
                *pAmountProcessed = i;
                break;
            }
            strLength += 1;
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Allocate space for processed string
        size_t strPos = 0;
        processedString = JlAlloc( strLength + 1 );
        if( NULL != processedString )
        {
            // Process string
            for( size_t i=IsBareWord?0:1; i<strEndPos; i++ )     // Skip first char which is double quote unless IsBareWord true
            {
                char currentChar = String[i];

                if( '\\' == currentChar )
                {
                    // Escaped chars. (There will definitely be at least one character after this
                    // due to the way we parsed in previous loop)
                    char nextChar = String[i+1];
                    char nextNextChar = String[i+2];
                    if( 'n' == nextChar )
                    {
                        processedString[strPos] = '\n';
                        strPos += 1;
                    }
                    else if( 'r' == nextChar )
                    {
                        processedString[strPos] = '\r';
                        strPos += 1;
                    }
                    else if( 'f' == nextChar )
                    {
                        processedString[strPos] = '\f';
                        strPos += 1;
                    }
                    else if( 'b' == nextChar )
                    {
                        processedString[strPos] = '\b';
                        strPos += 1;
                    }
                    else if( 't' == nextChar )
                    {
                        processedString[strPos] = '\t';
                        strPos += 1;
                    }
                    else if( '\\' == nextChar )
                    {
                        processedString[strPos] = '\\';
                        strPos += 1;
                    }
                    else if( '/' == nextChar )
                    {
                        processedString[strPos] = '/';
                        strPos += 1;
                    }
                    else if( '\"' == nextChar )
                    {
                        processedString[strPos] = '\"';
                        strPos += 1;
                    }
                    else if( '\'' == nextChar )
                    {
                        processedString[strPos] = '\'';
                        strPos += 1;
                    }
                    else if( 'u' == nextChar )
                    {
                        size_t numExtraCharsRead = 0;
                        // attempt to convert the escaped unicode value.
                        jlStatus = ConvertEscapedUnicode( String+i+2, strLength-i-1, processedString, &strPos, &numExtraCharsRead );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            // skip the processed chars (note this is after the \u, we will also skip the \u part later)
                            // numCharsRead will be either 4 or 10 depending whether surrogate pairs were used/
                            i += numExtraCharsRead;
                        }
                        else
                        {
                            *pAmountProcessed = i;
                            break;
                        }
                    }
                    else if( AllowNewLines && ( '\r' == nextChar || '\n' == nextChar ) )
                    {
                        // Escaped new lines are allowed, they get discarded
                        if( '\r' == nextChar && '\n' == nextNextChar )
                        {
                            // the Windows CR/LF was escaped without a separate escape for the \n
                            i += 1;  // skip the extra one
                        }
                    }
                    else
                    {
                        // Invalid escape char
                        jlStatus = JL_STATUS_INVALID_DATA;
                        *pAmountProcessed = i;
                        break;
                    }
                    i += 1;  // Skip the char after the initial backslash as we have processed it
                }
                else
                {
                    processedString[strPos] = currentChar;
                    strPos += 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pProcessedString = processedString;
                *pAmountProcessed = strEndPos + (IsBareWord ? 0 : 1);     // If not bareword then also skip the ending quote
            }
            else
            {
                JlFree( processedString );
            }
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }

    return jlStatus;
}